

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O3

size_t __thiscall hrvo::Simulator::addAgent(Simulator *this,Vector2 *position,size_t goalNo)

{
  iterator __position;
  Agent *this_00;
  pointer ppAVar1;
  runtime_error *this_01;
  Agent *agent;
  Agent *local_48 [2];
  
  if (this->defaults_ != (Agent *)0x0) {
    this_00 = (Agent *)operator_new(0xd8);
    Agent::Agent(this_00,this,position,goalNo);
    __position._M_current =
         (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_48[0] = this_00;
      std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::_M_realloc_insert
                (&this->agents_,__position,local_48);
      ppAVar1 = (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = this_00;
      ppAVar1 = (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_finish + 1;
      (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppAVar1;
    }
    return ((long)ppAVar1 -
            (long)(this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48[0] = (Agent *)&stack0xffffffffffffffc8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"Agent defaults not set when adding agent.","");
  std::runtime_error::runtime_error(this_01,(string *)local_48);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::size_t Simulator::addAgent(const Vector2 &position, std::size_t goalNo) {
  if (defaults_ == NULL) {
    throw std::runtime_error("Agent defaults not set when adding agent.");
  }

  Agent *const agent = new Agent(this, position, goalNo);
  agents_.push_back(agent);

  return agents_.size() - 1U;
}